

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O0

int4 __thiscall ActionDynamicSymbols::apply(ActionDynamicSymbols *this,Funcdata *data)

{
  bool bVar1;
  int iVar2;
  int4 iVar3;
  int4 iVar4;
  OpCode OVar5;
  ScopeLocal *pSVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint8 h;
  Symbol *pSVar7;
  string *psVar8;
  ostream *poVar9;
  PcodeOp *pPVar10;
  HighVariable *this_00;
  Datatype *pDVar11;
  Datatype *pDVar12;
  string local_458 [32];
  ostringstream local_438 [8];
  ostringstream s_1;
  int4 local_2bc;
  int4 offset;
  PcodeOp *castop;
  Varnode *newvn;
  ostringstream local_288 [8];
  ostringstream s;
  undefined1 local_110 [24];
  Varnode *vn;
  Symbol *local_e8;
  Symbol *sym;
  SymbolEntry *entry;
  DynamicHash dhash;
  _List_const_iterator<SymbolEntry> local_48;
  iterator local_40;
  _List_const_iterator<SymbolEntry> local_38;
  _List_const_iterator<SymbolEntry> local_30;
  const_iterator enditer;
  const_iterator iter;
  ScopeLocal *localmap;
  Funcdata *data_local;
  ActionDynamicSymbols *this_local;
  
  pSVar6 = Funcdata::getScopeLocal(data);
  std::_List_const_iterator<SymbolEntry>::_List_const_iterator(&enditer);
  std::_List_const_iterator<SymbolEntry>::_List_const_iterator(&local_30);
  iVar2 = (*(pSVar6->super_ScopeInternal).super_Scope._vptr_Scope[0xc])();
  local_40._M_node = (_List_node_base *)CONCAT44(extraout_var,iVar2);
  std::_List_const_iterator<SymbolEntry>::_List_const_iterator(&local_38,&local_40);
  enditer._M_node = local_38._M_node;
  iVar2 = (*(pSVar6->super_ScopeInternal).super_Scope._vptr_Scope[0xd])();
  dhash.hash = CONCAT44(extraout_var_00,iVar2);
  std::_List_const_iterator<SymbolEntry>::_List_const_iterator(&local_48,(iterator *)&dhash.hash);
  local_30._M_node = local_48._M_node;
  DynamicHash::DynamicHash((DynamicHash *)&entry);
  do {
    do {
      while( true ) {
        do {
          bVar1 = std::operator!=(&enditer,&local_30);
          if (!bVar1) {
            DynamicHash::~DynamicHash((DynamicHash *)&entry);
            return 0;
          }
          sym = (Symbol *)std::_List_const_iterator<SymbolEntry>::operator*(&enditer);
          std::_List_const_iterator<SymbolEntry>::operator++(&enditer);
          local_e8 = SymbolEntry::getSymbol((SymbolEntry *)sym);
          DynamicHash::clear((DynamicHash *)&entry);
          SymbolEntry::getFirstUseAddress((SymbolEntry *)local_110);
          h = SymbolEntry::getHash((SymbolEntry *)sym);
          local_110._16_8_ =
               DynamicHash::findVarnode((DynamicHash *)&entry,data,(Address *)local_110,h);
        } while (((Varnode *)local_110._16_8_ == (Varnode *)0x0) ||
                (pSVar7 = (Symbol *)Varnode::getSymbolEntry((Varnode *)local_110._16_8_),
                pSVar7 == sym));
        iVar3 = Varnode::getSize((Varnode *)local_110._16_8_);
        iVar4 = SymbolEntry::getSize((SymbolEntry *)sym);
        if (iVar3 == iVar4) break;
        std::__cxx11::ostringstream::ostringstream(local_288);
        std::operator<<((ostream *)local_288,"Unable to use symbol ");
        bVar1 = Symbol::isNameUndefined(local_e8);
        if (!bVar1) {
          psVar8 = Symbol::getName_abi_cxx11_(local_e8);
          poVar9 = std::operator<<((ostream *)local_288,(string *)psVar8);
          std::operator<<(poVar9,' ');
        }
        std::operator<<((ostream *)local_288,": Size does not match variable it labels");
        std::__cxx11::ostringstream::str();
        Funcdata::warningHeader(data,(string *)&newvn);
        std::__cxx11::string::~string((string *)&newvn);
        std::__cxx11::ostringstream::~ostringstream(local_288);
      }
      pSVar7 = (Symbol *)Varnode::getSymbolEntry((Varnode *)local_110._16_8_);
    } while (pSVar7 == sym);
    bVar1 = Varnode::isImplied((Varnode *)local_110._16_8_);
    if (bVar1) {
      castop = (PcodeOp *)0x0;
      bVar1 = Varnode::isWritten((Varnode *)local_110._16_8_);
      if (bVar1) {
        pPVar10 = Varnode::getDef((Varnode *)local_110._16_8_);
        OVar5 = PcodeOp::code(pPVar10);
        if (OVar5 != CPUI_CAST) goto LAB_00664c80;
        pPVar10 = Varnode::getDef((Varnode *)local_110._16_8_);
        castop = (PcodeOp *)PcodeOp::getIn(pPVar10,0);
      }
      else {
LAB_00664c80:
        pPVar10 = Varnode::loneDescend((Varnode *)local_110._16_8_);
        if ((pPVar10 != (PcodeOp *)0x0) && (OVar5 = PcodeOp::code(pPVar10), OVar5 == CPUI_CAST)) {
          castop = (PcodeOp *)PcodeOp::getOut(pPVar10);
        }
      }
      if ((castop != (PcodeOp *)0x0) && (bVar1 = Varnode::isExplicit((Varnode *)castop), bVar1)) {
        local_110._16_8_ = castop;
      }
    }
    bVar1 = SymbolEntry::isPiece((SymbolEntry *)sym);
    if (bVar1) {
      local_2bc = SymbolEntry::getOffset((SymbolEntry *)sym);
    }
    else {
      local_2bc = -1;
    }
    this_00 = Varnode::getHigh((Varnode *)local_110._16_8_);
    HighVariable::setSymbol(this_00,local_e8,local_2bc);
    bVar1 = Symbol::isTypeLocked(local_e8);
    pSVar7 = local_e8;
    if (bVar1) {
      pDVar11 = Symbol::getType(local_e8);
      pDVar12 = Varnode::getType((Varnode *)local_110._16_8_);
      if (pDVar11 != pDVar12) {
        std::__cxx11::ostringstream::ostringstream(local_438);
        poVar9 = std::operator<<((ostream *)local_438,"Unable to use type for symbol ");
        psVar8 = Symbol::getName_abi_cxx11_(local_e8);
        std::operator<<(poVar9,(string *)psVar8);
        std::__cxx11::ostringstream::str();
        Funcdata::warningHeader(data,local_458);
        std::__cxx11::string::~string((string *)local_458);
        pSVar7 = local_e8;
        pDVar11 = Varnode::getType((Varnode *)local_110._16_8_);
        (*(pSVar6->super_ScopeInternal).super_Scope._vptr_Scope[0x15])(pSVar6,pSVar7,pDVar11);
        std::__cxx11::ostringstream::~ostringstream(local_438);
      }
    }
    else {
      pDVar11 = Varnode::getType((Varnode *)local_110._16_8_);
      (*(pSVar6->super_ScopeInternal).super_Scope._vptr_Scope[0x15])(pSVar6,pSVar7,pDVar11);
    }
    (this->super_Action).count = (this->super_Action).count + 1;
  } while( true );
}

Assistant:

int4 ActionDynamicSymbols::apply(Funcdata &data)

{
  ScopeLocal *localmap = data.getScopeLocal();
  list<SymbolEntry>::const_iterator iter,enditer;
  iter = localmap->beginDynamic();
  enditer = localmap->endDynamic();
  DynamicHash dhash;
  while(iter != enditer) {
    const SymbolEntry &entry( *iter );
    ++iter;
    Symbol *sym = entry.getSymbol();
    dhash.clear();
    Varnode *vn = dhash.findVarnode(&data,entry.getFirstUseAddress(),entry.getHash());
    if (vn == (Varnode *)0) {
      //      localmap->removeSymbol(sym); // If it didn't map to anything, remove it
      continue;
    }
    if (vn->getSymbolEntry() == &entry) continue; // Already applied it
    if (vn->getSize() != entry.getSize()) {
      ostringstream s;
      s << "Unable to use symbol ";
      if (!sym->isNameUndefined())
	s << sym->getName() << ' ';
      s << ": Size does not match variable it labels";
      data.warningHeader(s.str());
      //      localmap->removeSymbol(sym); // Don't use the symbol
      continue;
    }
    if (vn->getSymbolEntry() == &entry) continue; // Already applied it

    if (vn->isImplied()) {	// This should be finding an explicit, but a cast may have been inserted
      Varnode *newvn = (Varnode *)0;
      // Look at the "other side" of the cast
      if (vn->isWritten() && (vn->getDef()->code() == CPUI_CAST))
	newvn = vn->getDef()->getIn(0);
      else {
	PcodeOp *castop = vn->loneDescend();
	if ((castop != (PcodeOp *)0)&&(castop->code() == CPUI_CAST))
	  newvn = castop->getOut();
      }
      // See if the varnode on the other side is explicit
      if ((newvn != (Varnode *)0)&&(newvn->isExplicit()))
	vn = newvn;		// in which case we use it
    }

    int4 offset;
    if (!entry.isPiece())
      offset = -1;
    else
      offset = entry.getOffset();
    vn->getHigh()->setSymbol(sym,offset);
    if (!sym->isTypeLocked()) {	// If the dynamic symbol did not lock its type
      localmap->retypeSymbol(sym,vn->getType()); // use the type propagated into the varnode
    }
    else if (sym->getType() != vn->getType()) {
      ostringstream s;
      s << "Unable to use type for symbol " << sym->getName();
      data.warningHeader(s.str());
      localmap->retypeSymbol(sym,vn->getType()); // use the type propagated into the varnode
    }
    // FIXME: Setting the symbol here (for the first time) gives the type no time to propagate properly
    // Currently the casts aren't set properly

    count += 1;
  }
  return 0;
}